

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::emitDisk(SemanticParser *this,SP *shape)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  bool bVar11;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  float fVar12;
  SP SVar13;
  SP ours;
  allocator local_99;
  undefined1 local_98 [32];
  __shared_ptr<pbrt::Disk,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<pbrt::Shape,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(in_RDX->_M_ptr->material).
              super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>);
  findOrCreateMaterial((SemanticParser *)local_98,(SP *)shape);
  std::make_shared<pbrt::Disk,std::shared_ptr<pbrt::Material>>
            ((shared_ptr<pbrt::Material> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  peVar1 = in_RDX->_M_ptr;
  fVar8 = (peVar1->transform).atStart.l.vx.x;
  fVar9 = (peVar1->transform).atStart.l.vx.y;
  p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(peVar1->transform).atStart.l.vx.z;
  fVar4 = (peVar1->transform).atStart.l.vy.y;
  fVar5 = (peVar1->transform).atStart.l.vy.z;
  fVar6 = (peVar1->transform).atStart.l.vz.x;
  fVar7 = (peVar1->transform).atStart.l.vz.y;
  fVar12 = (peVar1->transform).atStart.p.y;
  fVar3 = (peVar1->transform).atStart.p.z;
  *(undefined8 *)&((local_78._M_ptr)->transform).l.vz.z =
       *(undefined8 *)&(peVar1->transform).atStart.l.vz.z;
  ((local_78._M_ptr)->transform).p.y = fVar12;
  ((local_78._M_ptr)->transform).p.z = fVar3;
  ((local_78._M_ptr)->transform).l.vy.y = fVar4;
  ((local_78._M_ptr)->transform).l.vy.z = fVar5;
  ((local_78._M_ptr)->transform).l.vz.x = fVar6;
  ((local_78._M_ptr)->transform).l.vz.y = fVar7;
  ((local_78._M_ptr)->transform).l.vx.x = fVar8;
  ((local_78._M_ptr)->transform).l.vx.y = fVar9;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&((local_78._M_ptr)->transform).l.vx.z)->_M_pi =
       p_Var2;
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string((string *)local_98,"radius",&local_99);
  fVar12 = syntactic::ParamSet::getParam1f
                     (&(peVar1->super_Node).super_ParamSet,(string *)local_98,0.0);
  (local_78._M_ptr)->radius = fVar12;
  std::__cxx11::string::~string((string *)local_98);
  peVar1 = in_RDX->_M_ptr;
  std::__cxx11::string::string((string *)local_98,"height",&local_99);
  bVar11 = syntactic::ParamSet::hasParam1f(&(peVar1->super_Node).super_ParamSet,(string *)local_98);
  std::__cxx11::string::~string((string *)local_98);
  if (bVar11) {
    peVar1 = in_RDX->_M_ptr;
    std::__cxx11::string::string((string *)local_98,"height",&local_99);
    fVar12 = syntactic::ParamSet::getParam1f
                       (&(peVar1->super_Node).super_ParamSet,(string *)local_98,0.0);
    (local_78._M_ptr)->height = fVar12;
    std::__cxx11::string::~string((string *)local_98);
  }
  std::__shared_ptr<pbrt::Shape,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Disk,void>
            (local_50,&local_78);
  std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,in_RDX);
  extractTextures((SemanticParser *)shape,(SP *)local_50,(SP *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  _Var10._M_pi = local_78._M_refcount._M_pi;
  local_78._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78._M_ptr;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  local_78._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  SVar13.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar13.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar13.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitDisk(pbrt::syntactic::Shape::SP shape)
  {
    Disk::SP ours = std::make_shared<Disk>(findOrCreateMaterial(shape->material));

    ours->transform = shape->transform.atStart;
    ours->radius    = shape->getParam1f("radius");
        
    if (shape->hasParam1f("height"))
      ours->height    = shape->getParam1f("height");
        
    extractTextures(ours,shape);
      
    return ours;
  }